

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_large.c
# Opt level: O0

ssize_t memory_read(archive *a,void *client_data,void **buff)

{
  undefined8 local_30;
  ssize_t size;
  read_memory_data_conflict *mine;
  void **buff_local;
  void *client_data_local;
  archive *a_local;
  
  *buff = *(void **)((long)client_data + 8);
  local_30 = *(long *)((long)client_data + 0x10) - *(long *)((long)client_data + 8);
  if (*(long *)((long)client_data + 0x18) < local_30) {
    local_30 = *(long *)((long)client_data + 0x18);
  }
  *(long *)((long)client_data + 8) = local_30 + *(long *)((long)client_data + 8);
  return local_30;
}

Assistant:

static ssize_t
memory_read(struct archive *a, void *_private, const void **buff)
{
	struct memdata *private = _private;
	struct memblock *block;
	ssize_t size;

	(void)a;

	free(private->buff);
	private->buff = NULL;
	if (private->first == NULL) {
		private->last = NULL;
		return (ARCHIVE_EOF);
	}
	if (private->filebytes > 0) {
		/*
		 * We're returning file bytes, simulate it by
		 * passing blocks from the template data.
		 */
		if (private->filebytes > (int64_t)filedatasize)
			size = (ssize_t)filedatasize;
		else
			size = (ssize_t)private->filebytes;
		private->filebytes -= size;
		*buff = filedata;
	} else {
		/*
		 * We need to get some real data to return.
		 */
		block = private->first;
		private->first = block->next;
		size = (ssize_t)block->size;
		if (block->buff != NULL) {
			private->buff = block->buff;
			*buff = block->buff;
		} else {
			private->buff = NULL;
			*buff = filedata;
		}
		private->filebytes = block->filebytes;
		free(block);
	}
	return (size);
}